

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.cpp
# Opt level: O3

string * hmac::get_hash(string *__return_storage_ptr__,string *input,TypeHash type)

{
  pointer pcVar1;
  EVP_PKEY_CTX *pEVar2;
  size_type __dnew;
  uint8_t digest [20];
  SHA256 ctx;
  size_type local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ulong local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178 [32];
  pointer local_158;
  pointer puStack_150;
  pointer local_148;
  
  if (type == SHA512) {
    local_188 = 0;
    uStack_180 = 0;
    local_198 = 0;
    uStack_190 = 0;
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    pEVar2 = (EVP_PKEY_CTX *)0x0;
    memset((SHA512 *)local_178,0,0x150);
    hmac_hash::SHA512::init((SHA512 *)local_178,pEVar2);
    hmac_hash::SHA512::update
              ((SHA512 *)local_178,(uint8_t *)(input->_M_dataplus)._M_p,input->_M_string_length);
    hmac_hash::SHA512::finish((SHA512 *)local_178,(uint8_t *)&local_1b8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_1c0 = 0x40;
    pcVar1 = (pointer)std::__cxx11::string::_M_create
                                ((ulong *)__return_storage_ptr__,(ulong)&local_1c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c0;
    *(undefined8 *)(pcVar1 + 0x30) = local_188;
    *(undefined8 *)(pcVar1 + 0x38) = uStack_180;
    *(undefined8 *)(pcVar1 + 0x20) = local_198;
    *(undefined8 *)(pcVar1 + 0x28) = uStack_190;
    *(ulong *)(pcVar1 + 0x10) = local_1a8;
    *(undefined8 *)(pcVar1 + 0x18) = uStack_1a0;
    *(undefined8 *)pcVar1 = local_1b8;
    *(undefined8 *)(pcVar1 + 8) = uStack_1b0;
    __return_storage_ptr__->_M_string_length = local_1c0;
  }
  else {
    if (type != SHA256) {
      if (type != SHA1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8 = local_1a8 & 0xffffffff00000000;
      local_158 = (pointer)0x0;
      puStack_150 = (pointer)0x0;
      local_178[0x10] = '\0';
      local_178[0x11] = '\0';
      local_178[0x12] = '\0';
      local_178[0x13] = '\0';
      local_178[0x14] = '\0';
      local_178[0x15] = '\0';
      local_178[0x16] = '\0';
      local_178[0x17] = '\0';
      local_178._24_8_ = 0;
      local_178._0_8_ = 0;
      local_178._8_8_ = 0;
      local_148 = (pointer)0x0;
      hmac_hash::SHA1::init((SHA1 *)local_178,(EVP_PKEY_CTX *)input);
      hmac_hash::SHA1::update
                ((SHA1 *)local_178,(uchar *)(input->_M_dataplus)._M_p,input->_M_string_length);
      hmac_hash::SHA1::finish((SHA1 *)local_178,(uint8_t *)&local_1b8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_1c0 = 0x14;
      pcVar1 = (pointer)std::__cxx11::string::_M_create
                                  ((ulong *)__return_storage_ptr__,(ulong)&local_1c0);
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c0;
      *(undefined4 *)(pcVar1 + 0x10) = (undefined4)local_1a8;
      *(undefined8 *)pcVar1 = local_1b8;
      *(undefined8 *)(pcVar1 + 8) = uStack_1b0;
      __return_storage_ptr__->_M_string_length = local_1c0;
      (__return_storage_ptr__->_M_dataplus)._M_p[local_1c0] = '\0';
      if (local_158 == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_158);
      return __return_storage_ptr__;
    }
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_1b8 = 0;
    uStack_1b0 = 0;
    pEVar2 = (EVP_PKEY_CTX *)0x0;
    memset((SHA256 *)local_178,0,0xb0);
    hmac_hash::SHA256::init((SHA256 *)local_178,pEVar2);
    hmac_hash::SHA256::update
              ((SHA256 *)local_178,(uchar *)(input->_M_dataplus)._M_p,input->_M_string_length);
    hmac_hash::SHA256::finish((SHA256 *)local_178,(uint8_t *)&local_1b8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_1c0 = 0x20;
    pcVar1 = (pointer)std::__cxx11::string::_M_create
                                ((ulong *)__return_storage_ptr__,(ulong)&local_1c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c0;
    *(ulong *)(pcVar1 + 0x10) = local_1a8;
    *(undefined8 *)(pcVar1 + 0x18) = uStack_1a0;
    *(undefined8 *)pcVar1 = local_1b8;
    *(undefined8 *)(pcVar1 + 8) = uStack_1b0;
    __return_storage_ptr__->_M_string_length = local_1c0;
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  }
  pcVar1[local_1c0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string get_hash(const std::string &input, TypeHash type) {
        switch(type) {
            case TypeHash::SHA1: {
                uint8_t digest[hmac_hash::SHA1::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA1::DIGEST_SIZE, '\0');
                hmac_hash::SHA1 ctx = hmac_hash::SHA1();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA1::DIGEST_SIZE);
            }
            case TypeHash::SHA256: {
                uint8_t digest[hmac_hash::SHA256::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA256::DIGEST_SIZE, '\0');
                hmac_hash::SHA256 ctx = hmac_hash::SHA256();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA256::DIGEST_SIZE);
            }
            case TypeHash::SHA512: {
                uint8_t digest[hmac_hash::SHA512::DIGEST_SIZE];
                std::fill(digest, digest + hmac_hash::SHA512::DIGEST_SIZE, '\0');
                hmac_hash::SHA512 ctx = hmac_hash::SHA512();
                ctx.init();
                ctx.update((uint8_t*)input.c_str(), input.size());
                ctx.finish(digest);
                return std::string((const char*)digest, hmac_hash::SHA512::DIGEST_SIZE);
            }
            default: break;
        };
        return std::string();
    }